

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void GEO::CmdLine::ui_separator(string *title,string *short_title)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Logger *pLVar4;
  ostream *poVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  string shortt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pLVar4 = Logger::instance();
  if (pLVar4->quiet_ != false) {
    return;
  }
  if (::(anonymous_namespace)::man_mode == '\x01') {
    iVar3 = std::__cxx11::string::compare((char *)title);
    if (iVar3 == 0) {
      return;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    pcVar1 = (short_title->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + short_title->_M_string_length);
    if ((local_78._M_string_length == 0) || (*local_78._M_dataplus._M_p != '*')) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (\"",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":*\" options)",0xc);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_78);
      std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (\"",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":*\" options, advanced)",0x16);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    }
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    plVar6 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return;
    }
  }
  else {
    bVar2 = anon_unknown.dwarf_775ed::is_redirected();
    if (bVar2) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      iVar3 = std::__cxx11::string::compare((char *)short_title);
      if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)title), iVar3 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=[",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(short_title->_M_dataplus)._M_p,
                            short_title->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]=[",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(title->_M_dataplus)._M_p,title->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]=",2);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        return;
      }
      std::operator+(&local_78,title,short_title);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=[",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_78._M_dataplus._M_p,local_78._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]=",2);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return;
      }
    }
    else {
      anon_unknown.dwarf_775ed::update_ui_term_width();
      ::(anonymous_namespace)::ui_separator_opened = 1;
      lVar11 = short_title->_M_string_length + title->_M_string_length;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
      for (uVar9 = ::(anonymous_namespace)::ui_left_margin; uVar9 != 0; uVar9 = uVar9 - 1) {
        local_78._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_78._M_dataplus._M_p >> 8);
        local_78._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_78,1);
      }
      local_58 = lVar11;
      if (lVar11 != -0xe) {
        uVar10 = 1;
        do {
          local_78._M_dataplus._M_p._0_1_ = 0x5f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)&local_78,1);
          bVar2 = uVar10 < lVar11 + 0xeU;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      for (uVar9 = ::(anonymous_namespace)::ui_left_margin; uVar9 != 0; uVar9 = uVar9 - 1) {
        local_78._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_78._M_dataplus._M_p >> 8);
        local_78._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_78,1);
      }
      iVar3 = std::__cxx11::string::compare((char *)short_title);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)title), iVar3 == 0)) {
        std::operator+(&local_78,title,short_title);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," _/ =====[",10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                            local_78._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]===== \\",8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," _/ ==[",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(short_title->_M_dataplus)._M_p,
                            short_title->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]====[",6);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(title->_M_dataplus)._M_p,title->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]== \\",5);
      }
      uVar9 = ::(anonymous_namespace)::ui_term_width;
      anon_unknown.dwarf_775ed::update_ui_term_width();
      if (uVar9 < ::(anonymous_namespace)::ui_term_width) {
        ::(anonymous_namespace)::ui_term_width = uVar9;
      }
      uVar7 = (ulong)::(anonymous_namespace)::ui_term_width;
      uVar8 = (ulong)::(anonymous_namespace)::ui_right_margin +
              local_58 + (ulong)::(anonymous_namespace)::ui_left_margin + 0x13;
      uVar10 = 0;
      if (uVar8 <= uVar7) {
        uVar10 = uVar7 - uVar8;
      }
      if (uVar8 <= uVar7 && uVar7 - uVar8 != 0) {
        uVar7 = 1;
        do {
          local_78._M_dataplus._M_p._0_1_ = 0x5f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)&local_78,1);
          bVar2 = uVar7 < uVar10;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\n","");
      ui_message(&local_78,0x11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return;
      }
    }
  }
  operator_delete(local_78._M_dataplus._M_p);
  return;
}

Assistant:

void ui_separator(
            const std::string& title,
            const std::string& short_title
        ) {
            if(Logger::instance()->is_quiet()) {
                return;
            }

            if(man_mode) {
                if(title == "") {
                    return;
                }
                ui_out() << std::endl;
                std::string shortt = short_title;
                if(shortt.length() > 0 && shortt[0] == '*') {
                    shortt = shortt.substr(1, shortt.length()-1);
                    ui_out() << title << " (\"" << shortt << ":*\" options, advanced)"
                             << std::endl;
                } else {
                    ui_out() << title << " (\"" << shortt << ":*\" options)"
                             << std::endl;
                }
                ui_out() << std::endl << std::endl;                
                return;
            }
            
            if(is_redirected()) {
                ui_out() << std::endl;
                if(short_title != "" && title != "") {
                    ui_out() << "=[" << short_title << "]=["
                        << title << "]=" << std::endl;
                } else {
                    std::string s = title + short_title;
                    ui_out() << "=[" << s << "]=" << std::endl;
                }
                return;
            }

            update_ui_term_width();
            ui_separator_opened = true;

            size_t L = title.length() + short_title.length();

            ui_out() << "   ";
            ui_pad(' ', ui_left_margin);
            ui_pad('_', L + 14);
            ui_out() << std::endl;

            ui_pad(' ', ui_left_margin);
            if(short_title != "" && title != "") {
                ui_out() << " _/ ==[" << short_title << "]====["
                    << title << "]== \\";
            } else {
                std::string s = title + short_title;
                ui_out() << " _/ =====[" << s << "]===== \\";
            }

            ui_pad(
                '_',
                sub(
                    ui_terminal_width(),
                    19 + L + ui_left_margin + ui_right_margin
                )
            );
            ui_out() << std::endl;

            // Force a blank line under the separator
            ui_message("\n");
        }